

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::setNextPosAfter(QGridLayoutPrivate *this,int row,int col)

{
  int col_local;
  int row_local;
  QGridLayoutPrivate *this_local;
  
  if (((byte)this->field_0x194 >> 4 & 1) == 0) {
    if ((this->nextR < row) || ((row == this->nextR && (this->nextC <= col)))) {
      this->nextR = row;
      this->nextC = col + 1;
      if (this->cc <= this->nextC) {
        this->nextC = 0;
        this->nextR = this->nextR + 1;
      }
    }
  }
  else if ((this->nextC < col) || ((col == this->nextC && (this->nextR <= row)))) {
    this->nextR = row + 1;
    this->nextC = col;
    if (this->rr <= this->nextR) {
      this->nextR = 0;
      this->nextC = this->nextC + 1;
    }
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setNextPosAfter(int row, int col)
{
    if (addVertical) {
        if (col > nextC || (col == nextC && row >= nextR)) {
            nextR = row + 1;
            nextC = col;
            if (nextR >= rr) {
                nextR = 0;
                nextC++;
            }
        }
    } else {
        if (row > nextR || (row == nextR && col >= nextC)) {
            nextR = row;
            nextC = col + 1;
            if (nextC >= cc) {
                nextC = 0;
                nextR++;
            }
        }
    }
}